

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~MatcherBase(MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }